

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O1

void __thiscall libtorrent::aux::merkle_tree::optimize_storage(merkle_tree *this)

{
  pointer pdVar1;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var2;
  bool bVar3;
  int iVar4;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  __first;
  vector<sha256_hash> new_tree;
  allocator_type local_39;
  void *local_38 [2];
  long local_28;
  
  if (this->m_mode == full_tree) {
    if (this->m_num_blocks == 1) {
      pdVar1 = (this->m_tree).
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_tree).
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pdVar1) {
        (this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pdVar1;
      }
      if ((this->m_tree).
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (this->m_tree).
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::
        __shrink_to_fit_aux<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_true>
        ::_S_do_it(&(this->m_tree).
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                  );
      }
      this->m_mode = empty_tree;
      _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
           (this->m_block_verified).m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>;
      (this->m_block_verified).m_buf.
      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
      if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
        operator_delete__((void *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
        return;
      }
    }
    else {
      iVar4 = merkle_num_leafs(this->m_num_blocks);
      iVar4 = merkle_first_leaf(iVar4);
      bVar3 = bitfield::all_set(&this->m_block_verified);
      if (bVar3) {
        __first._M_current =
             (this->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar4;
        ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
        vector<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
                  ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                   local_38,__first,__first._M_current + this->m_num_blocks,&local_39);
        ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
        _M_move_assign(&(this->m_tree).
                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ,(vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                         *)local_38);
        this->m_mode = block_layer;
        _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
             (this->m_block_verified).m_buf.
             super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
             super__Head_base<0UL,_unsigned_int_*,_false>;
        (this->m_block_verified).m_buf.
        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
        super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
        if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
          operator_delete__((void *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl)
          ;
        }
        if (local_38[0] != (void *)0x0) {
          operator_delete(local_38[0],local_28 - (long)local_38[0]);
        }
      }
    }
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		if (m_num_blocks == 1)
		{
			// if this tree *just* has a root, no need to use any storage for
			// nodes
			m_tree.clear();
			m_tree.shrink_to_fit();
			m_mode = mode_t::empty_tree;
			m_block_verified.clear();
			return;
		}

		int const start = block_layer_start();
		if (m_block_verified.all_set())
		{
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + m_num_blocks);

			m_tree = std::move(new_tree);
			m_mode = mode_t::block_layer;
			m_block_verified.clear();
			return;
		}
	}